

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NanoVM.cpp
# Opt level: O3

void __thiscall NanoVM::NanoVM(NanoVM *this,uchar *code,uint64_t size)

{
  uint64_t uVar1;
  uchar *__dest;
  uchar *puVar2;
  ulong uVar3;
  
  uVar3 = size & 0xfffffffffffff000;
  uVar1 = uVar3 + 0x1000;
  (this->cpu).codeSize = 0;
  (this->cpu).stackSize = 0;
  (this->cpu).codeBase = (uchar *)0x0;
  (this->cpu).stackBase = (uchar *)0x0;
  (this->cpu).registers[8] = 0;
  (this->cpu).registers[9] = 0;
  (this->cpu).registers[6] = 0;
  (this->cpu).registers[7] = 0;
  (this->cpu).registers[4] = 0;
  (this->cpu).registers[5] = 0;
  (this->cpu).registers[2] = 0;
  (this->cpu).registers[3] = 0;
  (this->cpu).registers[0] = 0;
  (this->cpu).registers[1] = 0;
  (this->cpu).bytecodeSize = 0;
  (this->cpu).codeSize = uVar1;
  (this->cpu).stackSize = 0x1000;
  __dest = (uchar *)malloc(uVar3 + 0x200a);
  (this->cpu).codeBase = __dest;
  puVar2 = __dest + uVar3 + 0x1000;
  (this->cpu).stackBase = puVar2;
  puVar2[0] = '\0';
  puVar2[1] = '\0';
  puVar2[2] = '\0';
  puVar2[3] = '\0';
  puVar2[4] = '\0';
  puVar2[5] = '\0';
  puVar2[6] = '\0';
  puVar2[7] = '\0';
  puVar2 = __dest + uVar3 + 0x1008;
  puVar2[0] = '\0';
  puVar2[1] = '\0';
  puVar2[2] = '\0';
  puVar2[3] = '\0';
  puVar2[4] = '\0';
  puVar2[5] = '\0';
  puVar2[6] = '\0';
  puVar2[7] = '\0';
  (__dest + uVar3 + 0x1010)[0] = '\0';
  (__dest + uVar3 + 0x1010)[1] = '\0';
  memcpy(__dest,code,size);
  (this->cpu).registers[8] = 0;
  (this->cpu).registers[7] = uVar1;
  (this->cpu).registers[6] = uVar1;
  return;
}

Assistant:

NanoVM::NanoVM(unsigned char* code, uint64_t size) {
	cpu.bytecodeSize = size;
	// Initialize cpu
	memset(&cpu, 0x00, sizeof(cpu));
	// Zero out registers
	memset(cpu.registers, 0x00, sizeof(cpu.registers));
	cpu.codeSize = (NANOVM_PAGE_SIZE * (1 + (size / NANOVM_PAGE_SIZE)));
	cpu.stackSize = NANOVM_PAGE_SIZE;
	// allocate whole memory, code pages, stack, +10 bytes
	// +10 bytes is for instruction fetching which might read more bytes than the instruction size
	// This avoids reading memory out side of the VM
	cpu.codeBase = (unsigned char*) malloc(cpu.stackSize + 10 + cpu.codeSize);
	// Set stack base. Stack grows up instead of down like in x86
	cpu.stackBase = cpu.codeBase + cpu.codeSize;
	// Zero out stack + the last 10 bytes
	memset(cpu.stackBase, 0x00, sizeof(cpu.stackSize) + 10);
	// copy the bytecode to the vm
	memcpy(cpu.codeBase, code, size);
	// Set IP to the beginning of code
	cpu.registers[ip] = 0;
	cpu.registers[esp] = cpu.codeSize;
	cpu.registers[bp] = cpu.codeSize;
}